

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

List<Kernel::Unit_*> *
Lib::List<Kernel::Unit_*>::concat(List<Kernel::Unit_*> *first,List<Kernel::Unit_*> *second)

{
  List<Kernel::Unit_*> *pLVar1;
  List<Kernel::Unit_*> *in_RSI;
  List<Kernel::Unit_*> *in_RDI;
  List<Kernel::Unit_*> *next;
  List<Kernel::Unit_*> *current;
  List<Kernel::Unit_*> *local_20;
  List<Kernel::Unit_*> *local_8;
  
  local_8 = in_RSI;
  if ((in_RDI != (List<Kernel::Unit_*> *)0x0) &&
     (pLVar1 = in_RDI, local_8 = in_RDI, in_RSI != (List<Kernel::Unit_*> *)0x0)) {
    do {
      local_20 = pLVar1;
      pLVar1 = tail(local_20);
    } while (pLVar1 != (List<Kernel::Unit_*> *)0x0);
    setTail(local_20,in_RSI);
  }
  return local_8;
}

Assistant:

static List* concat(List* first,List* second)
  {
    if (first == 0) return second;
    if (second == 0) return first;

    List* current = first;
    for (;;) {
      List* next = current->tail();
      if (! next) {
        current->setTail(second);
        return first;
      }
      current = next;
    }
  }